

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O3

Request * __thiscall
ROM::Request::append(Request *__return_storage_ptr__,Request *this,Type type,Request *rhs)

{
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *pvVar1;
  Type TVar2;
  Type TVar3;
  Name NVar4;
  Request *pRVar5;
  bool bVar6;
  
  TVar2 = (this->node).type;
  TVar3 = (rhs->node).type;
  if ((TVar2 == One) && ((this->node).name == None)) {
    pRVar5 = rhs;
    if ((TVar3 != One) || (bVar6 = true, (rhs->node).name != None)) goto LAB_003b8d09;
  }
  else {
    bVar6 = (rhs->node).name == None;
  }
  if ((TVar3 != One) || (pRVar5 = this, !bVar6)) {
    if ((TVar2 ^ type) == Any && (TVar3 ^ type) == Any) {
      (__return_storage_ptr__->node).is_optional = (this->node).is_optional;
      NVar4 = (this->node).name;
      (__return_storage_ptr__->node).type = (this->node).type;
      (__return_storage_ptr__->node).name = NVar4;
      pvVar1 = &(__return_storage_ptr__->node).children;
      std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::vector
                (pvVar1,&(this->node).children);
      std::vector<ROM::Request::Node,std::allocator<ROM::Request::Node>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<ROM::Request::Node_const*,std::vector<ROM::Request::Node,std::allocator<ROM::Request::Node>>>>
                ((vector<ROM::Request::Node,std::allocator<ROM::Request::Node>> *)pvVar1,
                 (__return_storage_ptr__->node).children.
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_finish,
                 (rhs->node).children.
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 (rhs->node).children.
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      Node::sort(&__return_storage_ptr__->node);
      return __return_storage_ptr__;
    }
    if ((TVar2 ^ type) == Any && TVar3 == One) {
      (__return_storage_ptr__->node).is_optional = (this->node).is_optional;
      NVar4 = (this->node).name;
      (__return_storage_ptr__->node).type = (this->node).type;
      (__return_storage_ptr__->node).name = NVar4;
      pvVar1 = &(__return_storage_ptr__->node).children;
      std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::vector
                (pvVar1,&(this->node).children);
      std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::push_back
                (pvVar1,&rhs->node);
      Node::sort(&__return_storage_ptr__->node);
      return __return_storage_ptr__;
    }
    if (TVar2 == One && (TVar3 ^ type) == Any) {
      (__return_storage_ptr__->node).is_optional = (rhs->node).is_optional;
      NVar4 = (rhs->node).name;
      (__return_storage_ptr__->node).type = (rhs->node).type;
      (__return_storage_ptr__->node).name = NVar4;
      pvVar1 = &(__return_storage_ptr__->node).children;
      std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::vector
                (pvVar1,&(rhs->node).children);
      std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::push_back
                (pvVar1,&this->node);
      Node::sort(&__return_storage_ptr__->node);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->node).name = None;
    (__return_storage_ptr__->node).is_optional = false;
    pvVar1 = &(__return_storage_ptr__->node).children;
    (__return_storage_ptr__->node).children.
    super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->node).children.
    super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->node).children.
    super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->node).type = type;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::push_back
              (pvVar1,&this->node);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::push_back
              (pvVar1,&rhs->node);
    return __return_storage_ptr__;
  }
LAB_003b8d09:
  (__return_storage_ptr__->node).is_optional = (pRVar5->node).is_optional;
  NVar4 = (pRVar5->node).name;
  (__return_storage_ptr__->node).type = (pRVar5->node).type;
  (__return_storage_ptr__->node).name = NVar4;
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::vector
            (&(__return_storage_ptr__->node).children,&(pRVar5->node).children);
  return __return_storage_ptr__;
}

Assistant:

Request Request::append(Node::Type type, const Request &rhs) {
	// If either side is empty, act appropriately.
	if(node.empty() && !rhs.node.empty()) {
		return rhs;
	}
	if(rhs.node.empty()) {
		return *this;
	}

	// Just copy in the RHS child nodes if types match.
	if(node.type == type && rhs.node.type == type) {
		Request new_request = *this;
		new_request.node.children.insert(new_request.node.children.end(), rhs.node.children.begin(), rhs.node.children.end());
		new_request.node.sort();
		return new_request;
	}

	// Possibly: left is appropriate request and rhs is just one more thing?
	if(node.type == type && rhs.node.type == Node::Type::One) {
		Request new_request = *this;
		new_request.node.children.push_back(rhs.node);
		new_request.node.sort();
		return new_request;
	}

	// Or: right is appropriate request and this is just one more thing?
	if(rhs.node.type == type && node.type == Node::Type::One) {
		Request new_request = rhs;
		new_request.node.children.push_back(node);
		new_request.node.sort();
		return new_request;
	}

	// Otherwise create a new parent node.
	Request parent;
	parent.node.type = type;
	parent.node.children.push_back(this->node);
	parent.node.children.push_back(rhs.node);
	return parent;
}